

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t *
container_lazy_ior(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  _Bool _Var1;
  array_container_t *src_1;
  container_t *pcVar2;
  run_container_t *prVar3;
  bitset_container_t *dst;
  undefined7 in_register_00000031;
  byte local_31;
  run_container_t *local_30;
  
  local_31 = type2;
  if ((int)CONCAT71(in_register_00000031,type1) == 4) {
    __assert_fail("type1 != SHARED_CONTAINER_TYPE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x156a,
                  "container_t *container_lazy_ior(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  }
  src_1 = (array_container_t *)container_unwrap_shared(c2,&local_31);
  local_30 = (run_container_t *)0x0;
  prVar3 = (run_container_t *)c1;
  switch((uint)local_31 + (uint)type1 * 4) {
  case 5:
    bitset_container_or((bitset_container_t *)c1,(bitset_container_t *)src_1,
                        (bitset_container_t *)c1);
    if (*c1 == 0x10000) {
      prVar3 = run_container_create_range(0,0x10000);
      *result_type = '\x03';
      return prVar3;
    }
    goto LAB_00114fae;
  case 6:
    array_bitset_container_lazy_union(src_1,(bitset_container_t *)c1,(bitset_container_t *)c1);
    goto LAB_00114fae;
  case 7:
    _Var1 = run_container_is_full((run_container_t *)src_1);
    if (_Var1) {
      prVar3 = run_container_create();
      *result_type = '\x03';
      run_container_copy((run_container_t *)src_1,prVar3);
      return prVar3;
    }
    run_bitset_container_lazy_union
              ((run_container_t *)src_1,(bitset_container_t *)c1,(bitset_container_t *)c1);
LAB_00114fae:
    *result_type = '\x01';
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x15d6,
                  "container_t *container_lazy_ior(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 9:
    prVar3 = (run_container_t *)bitset_container_create();
    *result_type = '\x01';
    array_bitset_container_lazy_union
              ((array_container_t *)c1,(bitset_container_t *)src_1,(bitset_container_t *)prVar3);
    break;
  case 10:
    _Var1 = array_array_container_lazy_inplace_union((array_container_t *)c1,src_1,&local_30);
    *result_type = '\x02' - _Var1;
    if (local_30 != (run_container_t *)0x0) {
      prVar3 = local_30;
    }
    if (_Var1) {
      prVar3 = local_30;
    }
    break;
  case 0xb:
    prVar3 = run_container_create();
    array_run_container_union((array_container_t *)c1,(run_container_t *)src_1,prVar3);
    *result_type = '\x03';
    break;
  case 0xd:
    _Var1 = run_container_is_full((run_container_t *)c1);
    if (!_Var1) {
      dst = bitset_container_create();
      run_bitset_container_lazy_union((run_container_t *)c1,(bitset_container_t *)src_1,dst);
      *result_type = '\x01';
      return dst;
    }
    goto LAB_00114f9a;
  case 0xe:
    array_run_container_inplace_union(src_1,(run_container_t *)c1);
LAB_00114f9a:
    *result_type = '\x03';
    break;
  case 0xf:
    run_container_union_inplace((run_container_t *)c1,(run_container_t *)src_1);
    *result_type = '\x03';
    pcVar2 = convert_run_to_efficient_container((run_container_t *)c1,result_type);
    return pcVar2;
  }
  return prVar3;
}

Assistant:

static inline container_t *container_lazy_ior(
    container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    assert(type1 != SHARED_CONTAINER_TYPE);
    // c1 = get_writable_copy_if_shared(c1,&type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
#ifdef LAZY_OR_BITSET_CONVERSION_TO_FULL
            // if we have two bitsets, we might as well compute the cardinality
            bitset_container_or(const_CAST_bitset(c1),
                                const_CAST_bitset(c2),
                                CAST_bitset(c1));
            // it is possible that two bitsets can lead to a full container
            if (CAST_bitset(c1)->cardinality == (1 << 16)) {  // we convert
                result = run_container_create_range(0, (1 << 16));
                *result_type = RUN_CONTAINER_TYPE;
                return result;
            }
#else
            bitset_container_or_nocard(const_CAST_bitset(c1),
                                       const_CAST_bitset(c2),
                                       CAST_bitset(c1));

#endif
            *result_type = BITSET_CONTAINER_TYPE;
            return c1;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            *result_type = array_array_container_lazy_inplace_union(
                                CAST_array(c1),
                                const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            if((result == NULL)
               && (*result_type == ARRAY_CONTAINER_TYPE)) {
                 return c1; // the computation was done in-place!
            }
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            run_container_union_inplace(CAST_run(c1),
                                        const_CAST_run(c2));
            *result_type = RUN_CONTAINER_TYPE;
            return convert_run_to_efficient_container(CAST_run(c1),
                                                      result_type);

        case CONTAINER_PAIR(BITSET,ARRAY):
            array_bitset_container_lazy_union(
                    const_CAST_array(c2), const_CAST_bitset(c1),
                    CAST_bitset(c1));              // is lazy
            *result_type = BITSET_CONTAINER_TYPE;  // never array
            return c1;

        case CONTAINER_PAIR(ARRAY,BITSET):
            // c1 is an array, so no in-place possible
            result = bitset_container_create();
            *result_type = BITSET_CONTAINER_TYPE;
            array_bitset_container_lazy_union(
                    const_CAST_array(c1), const_CAST_bitset(c2),
                    CAST_bitset(result));  // is lazy
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            if (run_container_is_full(const_CAST_run(c2))) {
                result = run_container_create();
                *result_type = RUN_CONTAINER_TYPE;
                run_container_copy(const_CAST_run(c2),
                                   CAST_run(result));
                return result;
            }
            run_bitset_container_lazy_union(
                const_CAST_run(c2), const_CAST_bitset(c1),
                CAST_bitset(c1));  // allowed //  lazy
            *result_type = BITSET_CONTAINER_TYPE;
            return c1;

        case CONTAINER_PAIR(RUN,BITSET):
            if (run_container_is_full(const_CAST_run(c1))) {
                *result_type = RUN_CONTAINER_TYPE;
                return c1;
            }
            result = bitset_container_create();
            run_bitset_container_lazy_union(
                const_CAST_run(c1), const_CAST_bitset(c2),
                CAST_bitset(result));  //  lazy
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            result = run_container_create();
            array_run_container_union(const_CAST_array(c1),
                                      const_CAST_run(c2),
                                      CAST_run(result));
            *result_type = RUN_CONTAINER_TYPE;
            // next line skipped since we are lazy
            // result = convert_run_to_efficient_container_and_free(result,
            // result_type);
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            array_run_container_inplace_union(const_CAST_array(c2),
                                              CAST_run(c1));
            *result_type = RUN_CONTAINER_TYPE;
            // next line skipped since we are lazy
            // result = convert_run_to_efficient_container_and_free(result,
            // result_type);
            return c1;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}